

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void webfront::log::error<int,std::__cxx11::string>
               (string_view fmt,int *ts,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  bool bVar1;
  undefined1 in_stack_00000038 [16];
  
  bVar1 = anon_unknown_4::is('\x01');
  if (bVar1) {
    (anonymous_namespace)::log<int,std::__cxx11::string>
              (fmt._M_str._7_1_,(string_view)in_stack_00000038,(int *)fmt._M_len,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts);
  }
  return;
}

Assistant:

void infoHex(string_view text, auto container) { if (is(Info)) { log(Info, text); out(utils::hexDump(container)); }}